

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.cpp
# Opt level: O1

Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
* __thiscall
Corrade::Containers::BasicStringView<const_char>::split
          (Array<Corrade::Containers::BasicStringView<const_char>,_void_(*)(Corrade::Containers::BasicStringView<const_char>_*,_unsigned_long)>
           *__return_storage_ptr__,BasicStringView<const_char> *this,StringView delimiter)

{
  char *end;
  BasicStringView<const_char> *pBVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  char *data;
  ulong uVar5;
  BasicStringView<const_char> local_70;
  Error local_60;
  char *local_38;
  
  local_38 = delimiter._data;
  uVar5 = delimiter._sizePlusFlags & 0x3fffffffffffffff;
  if (((undefined1  [16])delimiter & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0)
  {
    poVar2 = Utility::Error::defaultOutput();
    Utility::Error::Error(&local_60,poVar2,(Flags)0x0);
    Utility::Debug::operator<<
              (&local_60.super_Debug,"Containers::StringView::split(): delimiter is empty");
LAB_0012b4cd:
    Utility::Error::~Error(&local_60);
    abort();
  }
  __return_storage_ptr__->_data = (BasicStringView<const_char> *)0x0;
  __return_storage_ptr__->_size = 0;
  __return_storage_ptr__->_deleter = (_func_void_BasicStringView<const_char>_ptr_unsigned_long *)0x0
  ;
  data = this->_data;
  uVar3 = this->_sizePlusFlags & 0x3fffffffffffffff;
  if (uVar3 != 0) {
    pcVar4 = data + uVar3;
    do {
      end = Implementation::stringFindString(data,(long)pcVar4 - (long)data,local_38,uVar5);
      if (end == (char *)0x0) break;
      local_70 = slice(this,data,end);
      if (__return_storage_ptr__->_deleter ==
          ArrayMallocAllocator<Corrade::Containers::BasicStringView<const_char>_>::deleter) {
        uVar3 = __return_storage_ptr__->_data[-1]._sizePlusFlags - 8 >> 4;
      }
      else {
        uVar3 = __return_storage_ptr__->_size;
      }
      if ((ulong)((long)&local_70 - (long)__return_storage_ptr__->_data >> 4) < uVar3) {
        poVar2 = Utility::Error::defaultOutput();
        Utility::Error::Error(&local_60,poVar2,(Flags)0x0);
        Utility::Debug::operator<<
                  (&local_60.super_Debug,
                   "Containers::arrayAppend(): use the list variant to append values from within the array itself"
                  );
        goto LAB_0012b4cd;
      }
      pBVar1 = Implementation::
               arrayGrowBy<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char_const>>>
                         (__return_storage_ptr__,1);
      pBVar1->_data = local_70._data;
      pBVar1->_sizePlusFlags = local_70._sizePlusFlags;
      data = end + uVar5;
    } while (data < pcVar4);
  }
  if ((this->_sizePlusFlags & 0x3fffffffffffffff) != 0) {
    local_70 = suffix(this,data);
    if (__return_storage_ptr__->_deleter ==
        ArrayMallocAllocator<Corrade::Containers::BasicStringView<const_char>_>::deleter) {
      uVar5 = __return_storage_ptr__->_data[-1]._sizePlusFlags - 8 >> 4;
    }
    else {
      uVar5 = __return_storage_ptr__->_size;
    }
    if ((ulong)((long)&local_70 - (long)__return_storage_ptr__->_data >> 4) < uVar5) {
      poVar2 = Utility::Error::defaultOutput();
      Utility::Error::Error(&local_60,poVar2,(Flags)0x0);
      Utility::Debug::operator<<
                (&local_60.super_Debug,
                 "Containers::arrayAppend(): use the list variant to append values from within the array itself"
                );
      goto LAB_0012b4cd;
    }
    pBVar1 = Implementation::
             arrayGrowBy<Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::ArrayMallocAllocator<Corrade::Containers::BasicStringView<char_const>>>
                       (__return_storage_ptr__,1);
    pBVar1->_data = local_70._data;
    pBVar1->_sizePlusFlags = local_70._sizePlusFlags;
  }
  return __return_storage_ptr__;
}

Assistant:

Array<BasicStringView<T>> BasicStringView<T>::split(const StringView delimiter) const {
    const char* const delimiterData = delimiter.data();
    const std::size_t delimiterSize = delimiter.size();
    CORRADE_ASSERT(delimiterSize, "Containers::StringView::split(): delimiter is empty", {});

    Array<BasicStringView<T>> parts;
    const char* const end = this->end();
    const char* oldpos = _data;
    const char* pos;
    while(oldpos < end && (pos = Implementation::stringFindString(oldpos, end - oldpos, delimiterData, delimiterSize))) {
        arrayAppend(parts, slice(const_cast<T*>(oldpos), const_cast<T*>(pos)));
        oldpos = pos + delimiterSize;
    }

    if(!isEmpty())
        arrayAppend(parts, suffix(const_cast<T*>(oldpos)));

    return parts;
}